

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O0

void capnp::_::anon_unknown_130::
     genericCheckTestMessageAllZero<capnproto_test::capnp::test::TestAllTypes::Reader>
               (Reader reader)

{
  bool bVar1;
  int8_t iVar2;
  uint8_t uVar3;
  int16_t iVar4;
  uint16_t uVar5;
  int32_t iVar6;
  uint32_t uVar7;
  uint uVar8;
  int64_t iVar9;
  uint64_t uVar10;
  float fVar11;
  double dVar12;
  Reader local_1028;
  uint local_ff4;
  uint local_ff0;
  bool local_fe9;
  undefined1 local_fe8 [7];
  bool _kj_shouldLog_59;
  Reader local_fb8;
  uint local_f84;
  uint local_f80;
  bool local_f79;
  undefined1 local_f78 [7];
  bool _kj_shouldLog_58;
  Reader local_f48;
  uint local_f14;
  uint local_f10;
  bool local_f09;
  undefined1 local_f08 [7];
  bool _kj_shouldLog_57;
  Reader local_ed8;
  uint local_ea4;
  uint local_ea0;
  bool local_e99;
  undefined1 local_e98 [7];
  bool _kj_shouldLog_56;
  Reader local_e68;
  uint local_e34;
  uint local_e30;
  bool local_e29;
  undefined1 local_e28 [7];
  bool _kj_shouldLog_55;
  Reader local_df8;
  uint local_dc4;
  uint local_dc0;
  bool local_db9;
  undefined1 local_db8 [7];
  bool _kj_shouldLog_54;
  Reader local_d88;
  uint local_d54;
  uint local_d50;
  bool local_d49;
  undefined1 local_d48 [7];
  bool _kj_shouldLog_53;
  Reader local_d18;
  uint local_ce4;
  uint local_ce0;
  bool local_cd9;
  undefined1 local_cd8 [7];
  bool _kj_shouldLog_52;
  Reader local_ca8;
  uint local_c74;
  uint local_c70;
  bool local_c69;
  undefined1 local_c68 [7];
  bool _kj_shouldLog_51;
  Reader local_c38;
  uint local_c04;
  uint local_c00;
  bool local_bf9;
  undefined1 local_bf8 [7];
  bool _kj_shouldLog_50;
  Reader local_bc8;
  uint local_b94;
  uint local_b90;
  bool local_b89;
  undefined1 local_b88 [7];
  bool _kj_shouldLog_49;
  Reader local_b58;
  uint local_b24;
  uint local_b20;
  bool local_b19;
  undefined1 local_b18 [7];
  bool _kj_shouldLog_48;
  Reader local_ae8;
  uint local_ab4;
  uint local_ab0;
  bool local_aa9;
  undefined1 local_aa8 [7];
  bool _kj_shouldLog_47;
  Reader local_a78;
  uint local_a44;
  uint local_a40;
  bool local_a39;
  undefined1 local_a38 [7];
  bool _kj_shouldLog_46;
  Reader local_a08;
  uint local_9d4;
  uint local_9d0;
  bool local_9c9;
  undefined1 local_9c8 [7];
  bool _kj_shouldLog_45;
  Reader local_998;
  uint local_964;
  uint local_960;
  bool local_959;
  undefined1 local_958 [7];
  bool _kj_shouldLog_44;
  Reader local_928;
  uint local_8f4;
  uint local_8f0;
  bool local_8e9;
  undefined1 local_8e8 [7];
  bool _kj_shouldLog_43;
  Reader local_8b8;
  uint local_884;
  uint local_880;
  bool local_879;
  undefined1 local_878 [7];
  bool _kj_shouldLog_42;
  Reader local_848;
  uint local_814;
  uint local_810;
  bool local_809;
  undefined1 local_808 [7];
  bool _kj_shouldLog_41;
  Reader local_7d8;
  uint local_7a4;
  uint local_7a0;
  bool local_799;
  undefined1 local_798 [7];
  bool _kj_shouldLog_40;
  Reader local_768;
  uint local_734;
  uint local_730;
  bool local_729;
  undefined1 local_728 [7];
  bool _kj_shouldLog_39;
  Reader local_6f8;
  uint local_6c4;
  uint local_6c0;
  bool local_6b9;
  undefined1 local_6b8 [7];
  bool _kj_shouldLog_38;
  Reader local_688;
  uint local_654;
  uint local_650;
  bool local_649;
  undefined1 local_648 [7];
  bool _kj_shouldLog_37;
  Reader local_618;
  uint local_5e4;
  uint local_5e0;
  bool local_5d9;
  undefined1 local_5d8 [7];
  bool _kj_shouldLog_36;
  Reader local_5a8;
  uint local_574;
  uint local_570;
  bool local_569;
  undefined1 local_568 [7];
  bool _kj_shouldLog_35;
  Reader local_538;
  uint local_504;
  uint local_500;
  bool local_4f9;
  undefined1 local_4f8 [7];
  bool _kj_shouldLog_34;
  Reader local_4c8;
  uint local_494;
  uint local_490;
  bool local_489;
  undefined1 local_488 [7];
  bool _kj_shouldLog_33;
  Reader local_458;
  uint local_424;
  uint local_420;
  bool local_419;
  undefined1 local_418 [7];
  bool _kj_shouldLog_32;
  Reader local_3e8;
  uint local_3b4;
  uint local_3b0;
  bool local_3a9;
  undefined1 local_3a8 [7];
  bool _kj_shouldLog_31;
  Reader local_378;
  uint local_344;
  uint local_340;
  bool local_339;
  undefined1 local_338 [7];
  bool _kj_shouldLog_30;
  Reader local_308;
  ArrayPtr<const_char> local_2d8;
  bool local_2c1;
  undefined1 local_2c0 [7];
  bool _kj_shouldLog_29;
  ArrayPtr<const_char> local_290;
  ArrayPtr<const_char> local_280;
  bool local_269;
  undefined1 auStack_268 [7];
  bool _kj_shouldLog_28;
  undefined1 local_258 [8];
  Reader subSubReader;
  ArrayPtr<const_unsigned_char> local_218;
  bool local_201;
  undefined1 auStack_200 [7];
  bool _kj_shouldLog_27;
  ArrayPtr<const_unsigned_char> local_1f0;
  ArrayPtr<const_char> local_1e0;
  bool local_1c9;
  undefined1 auStack_1c8 [7];
  bool _kj_shouldLog_26;
  int local_1b4;
  double local_1b0;
  bool local_1a5;
  int local_1a4;
  float fStack_1a0;
  bool _kj_shouldLog_25;
  bool local_199;
  uint64_t uStack_198;
  bool _kj_shouldLog_24;
  uint local_18c;
  bool local_185;
  uint32_t local_184;
  uint uStack_180;
  bool _kj_shouldLog_23;
  bool local_17b;
  uint16_t local_17a;
  uint local_178;
  bool _kj_shouldLog_22;
  bool local_172;
  uint8_t local_171;
  uint local_170;
  bool _kj_shouldLog_21;
  bool local_169;
  int64_t iStack_168;
  bool _kj_shouldLog_20;
  int local_15c;
  bool local_155;
  int32_t local_154;
  int iStack_150;
  bool _kj_shouldLog_19;
  bool local_14b;
  int16_t local_14a;
  int local_148;
  bool _kj_shouldLog_18;
  bool local_142;
  int8_t local_141;
  int local_140;
  bool _kj_shouldLog_17;
  bool local_139;
  bool local_138;
  bool local_137;
  bool local_136;
  Void local_134;
  bool local_133;
  bool _kj_shouldLog_16;
  undefined1 local_130 [2];
  bool _kj_shouldLog_15;
  bool _kj_shouldLog_14;
  Reader subReader;
  ArrayPtr<const_unsigned_char> local_f0;
  bool local_d9;
  undefined1 auStack_d8 [7];
  bool _kj_shouldLog_13;
  ArrayPtr<const_unsigned_char> local_c8;
  ArrayPtr<const_char> local_b8;
  bool local_a1;
  undefined1 auStack_a0 [7];
  bool _kj_shouldLog_12;
  int local_8c;
  double local_88;
  bool local_7d;
  int local_7c;
  float fStack_78;
  bool _kj_shouldLog_11;
  bool local_71;
  uint64_t uStack_70;
  bool _kj_shouldLog_10;
  uint local_64;
  bool local_5d;
  uint32_t local_5c;
  uint uStack_58;
  bool _kj_shouldLog_9;
  bool local_53;
  uint16_t local_52;
  uint local_50;
  bool _kj_shouldLog_8;
  bool local_4a;
  uint8_t local_49;
  uint local_48;
  bool _kj_shouldLog_7;
  bool local_41;
  int64_t iStack_40;
  bool _kj_shouldLog_6;
  int local_34;
  bool local_2d;
  int32_t local_2c;
  int iStack_28;
  bool _kj_shouldLog_5;
  bool local_23;
  int16_t local_22;
  int local_20;
  bool _kj_shouldLog_4;
  bool local_1a;
  int8_t local_19;
  int local_18;
  bool _kj_shouldLog_3;
  bool local_11;
  bool local_10;
  bool local_f;
  bool local_e;
  Void local_c;
  bool local_b;
  bool _kj_shouldLog_2;
  bool _kj_shouldLog_1;
  bool _kj_shouldLog;
  
  capnproto_test::capnp::test::TestAllTypes::Reader::getVoidField((Reader *)&stack0x00000008);
  bVar1 = Void::operator==((Void *)&VOID);
  if (!bVar1) {
    local_b = kj::_::Debug::shouldLog(ERROR);
    while (local_b != false) {
      capnproto_test::capnp::test::TestAllTypes::Reader::getVoidField((Reader *)&stack0x00000008);
      kj::_::Debug::log<char_const(&)[51],capnp::Void_const&,capnp::Void>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1be,ERROR,
                 "\"failed: expected \" \"(VOID) == (reader.getVoidField())\", VOID, reader.getVoidField()"
                 ,(char (*) [51])"failed: expected (VOID) == (reader.getVoidField())",(Void *)&VOID,
                 &local_c);
      local_b = false;
    }
  }
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Reader::getBoolField
                    ((Reader *)&stack0x00000008);
  if (bVar1) {
    local_e = kj::_::Debug::shouldLog(ERROR);
    while (local_e != false) {
      local_f = false;
      local_10 = capnproto_test::capnp::test::TestAllTypes::Reader::getBoolField
                           ((Reader *)&stack0x00000008);
      kj::_::Debug::log<char_const(&)[52],bool,bool>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1bf,ERROR,
                 "\"failed: expected \" \"(false) == (reader.getBoolField())\", false, reader.getBoolField()"
                 ,(char (*) [52])"failed: expected (false) == (reader.getBoolField())",&local_f,
                 &local_10);
      local_e = false;
    }
  }
  iVar2 = capnproto_test::capnp::test::TestAllTypes::Reader::getInt8Field
                    ((Reader *)&stack0x00000008);
  if (iVar2 != '\0') {
    local_11 = kj::_::Debug::shouldLog(ERROR);
    while (local_11 != false) {
      local_18 = 0;
      local_19 = capnproto_test::capnp::test::TestAllTypes::Reader::getInt8Field
                           ((Reader *)&stack0x00000008);
      kj::_::Debug::log<char_const(&)[48],int,signed_char>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1c0,ERROR,
                 "\"failed: expected \" \"(0) == (reader.getInt8Field())\", 0, reader.getInt8Field()"
                 ,(char (*) [48])"failed: expected (0) == (reader.getInt8Field())",&local_18,
                 &local_19);
      local_11 = false;
    }
  }
  iVar4 = capnproto_test::capnp::test::TestAllTypes::Reader::getInt16Field
                    ((Reader *)&stack0x00000008);
  if (iVar4 != 0) {
    local_1a = kj::_::Debug::shouldLog(ERROR);
    while (local_1a != false) {
      local_20 = 0;
      local_22 = capnproto_test::capnp::test::TestAllTypes::Reader::getInt16Field
                           ((Reader *)&stack0x00000008);
      kj::_::Debug::log<char_const(&)[49],int,short>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1c1,ERROR,
                 "\"failed: expected \" \"(0) == (reader.getInt16Field())\", 0, reader.getInt16Field()"
                 ,(char (*) [49])"failed: expected (0) == (reader.getInt16Field())",&local_20,
                 &local_22);
      local_1a = false;
    }
  }
  iVar6 = capnproto_test::capnp::test::TestAllTypes::Reader::getInt32Field
                    ((Reader *)&stack0x00000008);
  if (iVar6 != 0) {
    local_23 = kj::_::Debug::shouldLog(ERROR);
    while (local_23 != false) {
      iStack_28 = 0;
      local_2c = capnproto_test::capnp::test::TestAllTypes::Reader::getInt32Field
                           ((Reader *)&stack0x00000008);
      kj::_::Debug::log<char_const(&)[49],int,int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1c2,ERROR,
                 "\"failed: expected \" \"(0) == (reader.getInt32Field())\", 0, reader.getInt32Field()"
                 ,(char (*) [49])"failed: expected (0) == (reader.getInt32Field())",
                 &stack0xffffffffffffffd8,&local_2c);
      local_23 = false;
    }
  }
  iVar9 = capnproto_test::capnp::test::TestAllTypes::Reader::getInt64Field
                    ((Reader *)&stack0x00000008);
  if (iVar9 != 0) {
    local_2d = kj::_::Debug::shouldLog(ERROR);
    while (local_2d != false) {
      local_34 = 0;
      iStack_40 = capnproto_test::capnp::test::TestAllTypes::Reader::getInt64Field
                            ((Reader *)&stack0x00000008);
      kj::_::Debug::log<char_const(&)[49],int,long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1c3,ERROR,
                 "\"failed: expected \" \"(0) == (reader.getInt64Field())\", 0, reader.getInt64Field()"
                 ,(char (*) [49])"failed: expected (0) == (reader.getInt64Field())",&local_34,
                 &stack0xffffffffffffffc0);
      local_2d = false;
    }
  }
  uVar3 = capnproto_test::capnp::test::TestAllTypes::Reader::getUInt8Field
                    ((Reader *)&stack0x00000008);
  if (uVar3 != '\0') {
    local_41 = kj::_::Debug::shouldLog(ERROR);
    while (local_41 != false) {
      local_48 = 0;
      local_49 = capnproto_test::capnp::test::TestAllTypes::Reader::getUInt8Field
                           ((Reader *)&stack0x00000008);
      kj::_::Debug::log<char_const(&)[50],unsigned_int,unsigned_char>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1c4,ERROR,
                 "\"failed: expected \" \"(0u) == (reader.getUInt8Field())\", 0u, reader.getUInt8Field()"
                 ,(char (*) [50])"failed: expected (0u) == (reader.getUInt8Field())",&local_48,
                 &local_49);
      local_41 = false;
    }
  }
  uVar5 = capnproto_test::capnp::test::TestAllTypes::Reader::getUInt16Field
                    ((Reader *)&stack0x00000008);
  if (uVar5 != 0) {
    local_4a = kj::_::Debug::shouldLog(ERROR);
    while (local_4a != false) {
      local_50 = 0;
      local_52 = capnproto_test::capnp::test::TestAllTypes::Reader::getUInt16Field
                           ((Reader *)&stack0x00000008);
      kj::_::Debug::log<char_const(&)[51],unsigned_int,unsigned_short>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1c5,ERROR,
                 "\"failed: expected \" \"(0u) == (reader.getUInt16Field())\", 0u, reader.getUInt16Field()"
                 ,(char (*) [51])"failed: expected (0u) == (reader.getUInt16Field())",&local_50,
                 &local_52);
      local_4a = false;
    }
  }
  uVar7 = capnproto_test::capnp::test::TestAllTypes::Reader::getUInt32Field
                    ((Reader *)&stack0x00000008);
  if (uVar7 != 0) {
    local_53 = kj::_::Debug::shouldLog(ERROR);
    while (local_53 != false) {
      uStack_58 = 0;
      local_5c = capnproto_test::capnp::test::TestAllTypes::Reader::getUInt32Field
                           ((Reader *)&stack0x00000008);
      kj::_::Debug::log<char_const(&)[51],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1c6,ERROR,
                 "\"failed: expected \" \"(0u) == (reader.getUInt32Field())\", 0u, reader.getUInt32Field()"
                 ,(char (*) [51])"failed: expected (0u) == (reader.getUInt32Field())",
                 &stack0xffffffffffffffa8,&local_5c);
      local_53 = false;
    }
  }
  uVar10 = capnproto_test::capnp::test::TestAllTypes::Reader::getUInt64Field
                     ((Reader *)&stack0x00000008);
  if (uVar10 != 0) {
    local_5d = kj::_::Debug::shouldLog(ERROR);
    while (local_5d != false) {
      local_64 = 0;
      uStack_70 = capnproto_test::capnp::test::TestAllTypes::Reader::getUInt64Field
                            ((Reader *)&stack0x00000008);
      kj::_::Debug::log<char_const(&)[51],unsigned_int,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1c7,ERROR,
                 "\"failed: expected \" \"(0u) == (reader.getUInt64Field())\", 0u, reader.getUInt64Field()"
                 ,(char (*) [51])"failed: expected (0u) == (reader.getUInt64Field())",&local_64,
                 &stack0xffffffffffffff90);
      local_5d = false;
    }
  }
  fVar11 = capnproto_test::capnp::test::TestAllTypes::Reader::getFloat32Field
                     ((Reader *)&stack0x00000008);
  bVar1 = kj::_::floatAlmostEqual(fVar11,0.0);
  if (!bVar1) {
    local_71 = kj::_::Debug::shouldLog(ERROR);
    while (local_71 != false) {
      fStack_78 = capnproto_test::capnp::test::TestAllTypes::Reader::getFloat32Field
                            ((Reader *)&stack0x00000008);
      local_7c = 0;
      kj::_::Debug::log<char_const(&)[72],float,int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1c8,ERROR,
                 "\"failed: expected \" \"::kj::_::floatAlmostEqual(reader.getFloat32Field(), 0)\", reader.getFloat32Field(), 0"
                 ,(char (*) [72])
                  "failed: expected ::kj::_::floatAlmostEqual(reader.getFloat32Field(), 0)",
                 &stack0xffffffffffffff88,&local_7c);
      local_71 = false;
    }
  }
  dVar12 = capnproto_test::capnp::test::TestAllTypes::Reader::getFloat64Field
                     ((Reader *)&stack0x00000008);
  bVar1 = kj::_::doubleAlmostEqual(dVar12,0.0);
  if (!bVar1) {
    local_7d = kj::_::Debug::shouldLog(ERROR);
    while (local_7d != false) {
      local_88 = capnproto_test::capnp::test::TestAllTypes::Reader::getFloat64Field
                           ((Reader *)&stack0x00000008);
      local_8c = 0;
      kj::_::Debug::log<char_const(&)[73],double,int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1c9,ERROR,
                 "\"failed: expected \" \"::kj::_::doubleAlmostEqual(reader.getFloat64Field(), 0)\", reader.getFloat64Field(), 0"
                 ,(char (*) [73])
                  "failed: expected ::kj::_::doubleAlmostEqual(reader.getFloat64Field(), 0)",
                 &local_88,&local_8c);
      local_7d = false;
    }
  }
  _auStack_a0 = (ArrayPtr<const_char>)
                capnproto_test::capnp::test::TestAllTypes::Reader::getTextField
                          ((Reader *)&stack0x00000008);
  bVar1 = kj::operator==("",(StringPtr *)auStack_a0);
  if (!bVar1) {
    local_a1 = kj::_::Debug::shouldLog(ERROR);
    while (local_a1 != false) {
      local_b8 = (ArrayPtr<const_char>)
                 capnproto_test::capnp::test::TestAllTypes::Reader::getTextField
                           ((Reader *)&stack0x00000008);
      kj::_::Debug::log<char_const(&)[49],char_const(&)[1],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1ca,ERROR,
                 "\"failed: expected \" \"(\\\"\\\") == (reader.getTextField())\", \"\", reader.getTextField()"
                 ,(char (*) [49])"failed: expected (\"\") == (reader.getTextField())",
                 (char (*) [1])0x51fdd1,(Reader *)&local_b8);
      local_a1 = false;
    }
  }
  local_c8 = (ArrayPtr<const_unsigned_char>)_::data("");
  _auStack_d8 = (ArrayPtr<const_unsigned_char>)
                capnproto_test::capnp::test::TestAllTypes::Reader::getDataField
                          ((Reader *)&stack0x00000008);
  bVar1 = kj::ArrayPtr<const_unsigned_char>::operator==
                    (&local_c8,(ArrayPtr<const_unsigned_char> *)auStack_d8);
  if (!bVar1) {
    local_d9 = kj::_::Debug::shouldLog(ERROR);
    while (local_d9 != false) {
      local_f0 = (ArrayPtr<const_unsigned_char>)_::data("");
      join_0x00000010_0x00000000_ =
           (ArrayPtr<const_unsigned_char>)
           capnproto_test::capnp::test::TestAllTypes::Reader::getDataField
                     ((Reader *)&stack0x00000008);
      kj::_::Debug::log<char_const(&)[55],capnp::Data::Reader,capnp::Data::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1cb,ERROR,
                 "\"failed: expected \" \"(data(\\\"\\\")) == (reader.getDataField())\", data(\"\"), reader.getDataField()"
                 ,(char (*) [55])"failed: expected (data(\"\")) == (reader.getDataField())",
                 (Reader *)&local_f0,(Reader *)&subReader._reader.nestingLimit);
      local_d9 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Reader::getStructField
            ((Reader *)local_130,(Reader *)&stack0x00000008);
  capnproto_test::capnp::test::TestAllTypes::Reader::getVoidField((Reader *)local_130);
  bVar1 = Void::operator==((Void *)&VOID);
  if (!bVar1) {
    local_133 = kj::_::Debug::shouldLog(ERROR);
    while (local_133 != false) {
      capnproto_test::capnp::test::TestAllTypes::Reader::getVoidField((Reader *)local_130);
      kj::_::Debug::log<char_const(&)[54],capnp::Void_const&,capnp::Void>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1ce,ERROR,
                 "\"failed: expected \" \"(VOID) == (subReader.getVoidField())\", VOID, subReader.getVoidField()"
                 ,(char (*) [54])"failed: expected (VOID) == (subReader.getVoidField())",
                 (Void *)&VOID,&local_134);
      local_133 = false;
    }
  }
  bVar1 = capnproto_test::capnp::test::TestAllTypes::Reader::getBoolField((Reader *)local_130);
  if (bVar1) {
    local_136 = kj::_::Debug::shouldLog(ERROR);
    while (local_136 != false) {
      local_137 = false;
      local_138 = capnproto_test::capnp::test::TestAllTypes::Reader::getBoolField
                            ((Reader *)local_130);
      kj::_::Debug::log<char_const(&)[55],bool,bool>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1cf,ERROR,
                 "\"failed: expected \" \"(false) == (subReader.getBoolField())\", false, subReader.getBoolField()"
                 ,(char (*) [55])"failed: expected (false) == (subReader.getBoolField())",&local_137
                 ,&local_138);
      local_136 = false;
    }
  }
  iVar2 = capnproto_test::capnp::test::TestAllTypes::Reader::getInt8Field((Reader *)local_130);
  if (iVar2 != '\0') {
    local_139 = kj::_::Debug::shouldLog(ERROR);
    while (local_139 != false) {
      local_140 = 0;
      local_141 = capnproto_test::capnp::test::TestAllTypes::Reader::getInt8Field
                            ((Reader *)local_130);
      kj::_::Debug::log<char_const(&)[51],int,signed_char>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1d0,ERROR,
                 "\"failed: expected \" \"(0) == (subReader.getInt8Field())\", 0, subReader.getInt8Field()"
                 ,(char (*) [51])"failed: expected (0) == (subReader.getInt8Field())",&local_140,
                 &local_141);
      local_139 = false;
    }
  }
  iVar4 = capnproto_test::capnp::test::TestAllTypes::Reader::getInt16Field((Reader *)local_130);
  if (iVar4 != 0) {
    local_142 = kj::_::Debug::shouldLog(ERROR);
    while (local_142 != false) {
      local_148 = 0;
      local_14a = capnproto_test::capnp::test::TestAllTypes::Reader::getInt16Field
                            ((Reader *)local_130);
      kj::_::Debug::log<char_const(&)[52],int,short>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1d1,ERROR,
                 "\"failed: expected \" \"(0) == (subReader.getInt16Field())\", 0, subReader.getInt16Field()"
                 ,(char (*) [52])"failed: expected (0) == (subReader.getInt16Field())",&local_148,
                 &local_14a);
      local_142 = false;
    }
  }
  iVar6 = capnproto_test::capnp::test::TestAllTypes::Reader::getInt32Field((Reader *)local_130);
  if (iVar6 != 0) {
    local_14b = kj::_::Debug::shouldLog(ERROR);
    while (local_14b != false) {
      iStack_150 = 0;
      local_154 = capnproto_test::capnp::test::TestAllTypes::Reader::getInt32Field
                            ((Reader *)local_130);
      kj::_::Debug::log<char_const(&)[52],int,int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1d2,ERROR,
                 "\"failed: expected \" \"(0) == (subReader.getInt32Field())\", 0, subReader.getInt32Field()"
                 ,(char (*) [52])"failed: expected (0) == (subReader.getInt32Field())",
                 &stack0xfffffffffffffeb0,&local_154);
      local_14b = false;
    }
  }
  iVar9 = capnproto_test::capnp::test::TestAllTypes::Reader::getInt64Field((Reader *)local_130);
  if (iVar9 != 0) {
    local_155 = kj::_::Debug::shouldLog(ERROR);
    while (local_155 != false) {
      local_15c = 0;
      iStack_168 = capnproto_test::capnp::test::TestAllTypes::Reader::getInt64Field
                             ((Reader *)local_130);
      kj::_::Debug::log<char_const(&)[52],int,long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1d3,ERROR,
                 "\"failed: expected \" \"(0) == (subReader.getInt64Field())\", 0, subReader.getInt64Field()"
                 ,(char (*) [52])"failed: expected (0) == (subReader.getInt64Field())",&local_15c,
                 &stack0xfffffffffffffe98);
      local_155 = false;
    }
  }
  uVar3 = capnproto_test::capnp::test::TestAllTypes::Reader::getUInt8Field((Reader *)local_130);
  if (uVar3 != '\0') {
    local_169 = kj::_::Debug::shouldLog(ERROR);
    while (local_169 != false) {
      local_170 = 0;
      local_171 = capnproto_test::capnp::test::TestAllTypes::Reader::getUInt8Field
                            ((Reader *)local_130);
      kj::_::Debug::log<char_const(&)[53],unsigned_int,unsigned_char>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1d4,ERROR,
                 "\"failed: expected \" \"(0u) == (subReader.getUInt8Field())\", 0u, subReader.getUInt8Field()"
                 ,(char (*) [53])"failed: expected (0u) == (subReader.getUInt8Field())",&local_170,
                 &local_171);
      local_169 = false;
    }
  }
  uVar5 = capnproto_test::capnp::test::TestAllTypes::Reader::getUInt16Field((Reader *)local_130);
  if (uVar5 != 0) {
    local_172 = kj::_::Debug::shouldLog(ERROR);
    while (local_172 != false) {
      local_178 = 0;
      local_17a = capnproto_test::capnp::test::TestAllTypes::Reader::getUInt16Field
                            ((Reader *)local_130);
      kj::_::Debug::log<char_const(&)[54],unsigned_int,unsigned_short>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1d5,ERROR,
                 "\"failed: expected \" \"(0u) == (subReader.getUInt16Field())\", 0u, subReader.getUInt16Field()"
                 ,(char (*) [54])"failed: expected (0u) == (subReader.getUInt16Field())",&local_178,
                 &local_17a);
      local_172 = false;
    }
  }
  uVar7 = capnproto_test::capnp::test::TestAllTypes::Reader::getUInt32Field((Reader *)local_130);
  if (uVar7 != 0) {
    local_17b = kj::_::Debug::shouldLog(ERROR);
    while (local_17b != false) {
      uStack_180 = 0;
      local_184 = capnproto_test::capnp::test::TestAllTypes::Reader::getUInt32Field
                            ((Reader *)local_130);
      kj::_::Debug::log<char_const(&)[54],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1d6,ERROR,
                 "\"failed: expected \" \"(0u) == (subReader.getUInt32Field())\", 0u, subReader.getUInt32Field()"
                 ,(char (*) [54])"failed: expected (0u) == (subReader.getUInt32Field())",
                 &stack0xfffffffffffffe80,&local_184);
      local_17b = false;
    }
  }
  uVar10 = capnproto_test::capnp::test::TestAllTypes::Reader::getUInt64Field((Reader *)local_130);
  if (uVar10 != 0) {
    local_185 = kj::_::Debug::shouldLog(ERROR);
    while (local_185 != false) {
      local_18c = 0;
      uStack_198 = capnproto_test::capnp::test::TestAllTypes::Reader::getUInt64Field
                             ((Reader *)local_130);
      kj::_::Debug::log<char_const(&)[54],unsigned_int,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1d7,ERROR,
                 "\"failed: expected \" \"(0u) == (subReader.getUInt64Field())\", 0u, subReader.getUInt64Field()"
                 ,(char (*) [54])"failed: expected (0u) == (subReader.getUInt64Field())",&local_18c,
                 &stack0xfffffffffffffe68);
      local_185 = false;
    }
  }
  fVar11 = capnproto_test::capnp::test::TestAllTypes::Reader::getFloat32Field((Reader *)local_130);
  bVar1 = kj::_::floatAlmostEqual(fVar11,0.0);
  if (!bVar1) {
    local_199 = kj::_::Debug::shouldLog(ERROR);
    while (local_199 != false) {
      fStack_1a0 = capnproto_test::capnp::test::TestAllTypes::Reader::getFloat32Field
                             ((Reader *)local_130);
      local_1a4 = 0;
      kj::_::Debug::log<char_const(&)[75],float,int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1d8,ERROR,
                 "\"failed: expected \" \"::kj::_::floatAlmostEqual(subReader.getFloat32Field(), 0)\", subReader.getFloat32Field(), 0"
                 ,(char (*) [75])
                  "failed: expected ::kj::_::floatAlmostEqual(subReader.getFloat32Field(), 0)",
                 &stack0xfffffffffffffe60,&local_1a4);
      local_199 = false;
    }
  }
  dVar12 = capnproto_test::capnp::test::TestAllTypes::Reader::getFloat64Field((Reader *)local_130);
  bVar1 = kj::_::doubleAlmostEqual(dVar12,0.0);
  if (!bVar1) {
    local_1a5 = kj::_::Debug::shouldLog(ERROR);
    while (local_1a5 != false) {
      local_1b0 = capnproto_test::capnp::test::TestAllTypes::Reader::getFloat64Field
                            ((Reader *)local_130);
      local_1b4 = 0;
      kj::_::Debug::log<char_const(&)[76],double,int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1d9,ERROR,
                 "\"failed: expected \" \"::kj::_::doubleAlmostEqual(subReader.getFloat64Field(), 0)\", subReader.getFloat64Field(), 0"
                 ,(char (*) [76])
                  "failed: expected ::kj::_::doubleAlmostEqual(subReader.getFloat64Field(), 0)",
                 &local_1b0,&local_1b4);
      local_1a5 = false;
    }
  }
  _auStack_1c8 = (ArrayPtr<const_char>)
                 capnproto_test::capnp::test::TestAllTypes::Reader::getTextField
                           ((Reader *)local_130);
  bVar1 = kj::operator==("",(StringPtr *)auStack_1c8);
  if (!bVar1) {
    local_1c9 = kj::_::Debug::shouldLog(ERROR);
    while (local_1c9 != false) {
      local_1e0 = (ArrayPtr<const_char>)
                  capnproto_test::capnp::test::TestAllTypes::Reader::getTextField
                            ((Reader *)local_130);
      kj::_::Debug::log<char_const(&)[52],char_const(&)[1],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1da,ERROR,
                 "\"failed: expected \" \"(\\\"\\\") == (subReader.getTextField())\", \"\", subReader.getTextField()"
                 ,(char (*) [52])"failed: expected (\"\") == (subReader.getTextField())",
                 (char (*) [1])0x51fdd1,(Reader *)&local_1e0);
      local_1c9 = false;
    }
  }
  local_1f0 = (ArrayPtr<const_unsigned_char>)_::data("");
  _auStack_200 = (ArrayPtr<const_unsigned_char>)
                 capnproto_test::capnp::test::TestAllTypes::Reader::getDataField
                           ((Reader *)local_130);
  bVar1 = kj::ArrayPtr<const_unsigned_char>::operator==
                    (&local_1f0,(ArrayPtr<const_unsigned_char> *)auStack_200);
  if (!bVar1) {
    local_201 = kj::_::Debug::shouldLog(ERROR);
    while (local_201 != false) {
      local_218 = (ArrayPtr<const_unsigned_char>)_::data("");
      join_0x00000010_0x00000000_ =
           (ArrayPtr<const_unsigned_char>)
           capnproto_test::capnp::test::TestAllTypes::Reader::getDataField((Reader *)local_130);
      kj::_::Debug::log<char_const(&)[58],capnp::Data::Reader,capnp::Data::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1db,ERROR,
                 "\"failed: expected \" \"(data(\\\"\\\")) == (subReader.getDataField())\", data(\"\"), subReader.getDataField()"
                 ,(char (*) [58])"failed: expected (data(\"\")) == (subReader.getDataField())",
                 (Reader *)&local_218,(Reader *)&subSubReader._reader.nestingLimit);
      local_201 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Reader::getStructField
            ((Reader *)local_258,(Reader *)local_130);
  _auStack_268 = (ArrayPtr<const_char>)
                 capnproto_test::capnp::test::TestAllTypes::Reader::getTextField
                           ((Reader *)local_258);
  bVar1 = kj::operator==("",(StringPtr *)auStack_268);
  if (!bVar1) {
    local_269 = kj::_::Debug::shouldLog(ERROR);
    while (local_269 != false) {
      local_280 = (ArrayPtr<const_char>)
                  capnproto_test::capnp::test::TestAllTypes::Reader::getTextField
                            ((Reader *)local_258);
      kj::_::Debug::log<char_const(&)[55],char_const(&)[1],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1de,ERROR,
                 "\"failed: expected \" \"(\\\"\\\") == (subSubReader.getTextField())\", \"\", subSubReader.getTextField()"
                 ,(char (*) [55])"failed: expected (\"\") == (subSubReader.getTextField())",
                 (char (*) [1])0x51fdd1,(Reader *)&local_280);
      local_269 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Reader::getStructField
            ((Reader *)local_2c0,(Reader *)local_258);
  local_290 = (ArrayPtr<const_char>)
              capnproto_test::capnp::test::TestAllTypes::Reader::getTextField((Reader *)local_2c0);
  bVar1 = kj::operator==("",(StringPtr *)&local_290);
  if (!bVar1) {
    local_2c1 = kj::_::Debug::shouldLog(ERROR);
    while (local_2c1 != false) {
      capnproto_test::capnp::test::TestAllTypes::Reader::getStructField
                (&local_308,(Reader *)local_258);
      local_2d8 = (ArrayPtr<const_char>)
                  capnproto_test::capnp::test::TestAllTypes::Reader::getTextField(&local_308);
      kj::_::Debug::log<char_const(&)[72],char_const(&)[1],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1df,ERROR,
                 "\"failed: expected \" \"(\\\"\\\") == (subSubReader.getStructField().getTextField())\", \"\", subSubReader.getStructField().getTextField()"
                 ,(char (*) [72])
                  "failed: expected (\"\") == (subSubReader.getStructField().getTextField())",
                 (char (*) [1])0x51fdd1,(Reader *)&local_2d8);
      local_2c1 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Reader::getVoidList
            ((Reader *)local_338,(Reader *)local_130);
  uVar8 = List<capnp::Void,_(capnp::Kind)0>::Reader::size((Reader *)local_338);
  if (uVar8 != 0) {
    local_339 = kj::_::Debug::shouldLog(ERROR);
    while (local_339 != false) {
      local_340 = 0;
      capnproto_test::capnp::test::TestAllTypes::Reader::getVoidList(&local_378,(Reader *)local_130)
      ;
      local_344 = List<capnp::Void,_(capnp::Kind)0>::Reader::size(&local_378);
      kj::_::Debug::log<char_const(&)[58],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1e2,ERROR,
                 "\"failed: expected \" \"(0u) == (subReader.getVoidList().size())\", 0u, subReader.getVoidList().size()"
                 ,(char (*) [58])"failed: expected (0u) == (subReader.getVoidList().size())",
                 &local_340,&local_344);
      local_339 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Reader::getBoolList
            ((Reader *)local_3a8,(Reader *)local_130);
  uVar8 = List<bool,_(capnp::Kind)0>::Reader::size((Reader *)local_3a8);
  if (uVar8 != 0) {
    local_3a9 = kj::_::Debug::shouldLog(ERROR);
    while (local_3a9 != false) {
      local_3b0 = 0;
      capnproto_test::capnp::test::TestAllTypes::Reader::getBoolList(&local_3e8,(Reader *)local_130)
      ;
      local_3b4 = List<bool,_(capnp::Kind)0>::Reader::size(&local_3e8);
      kj::_::Debug::log<char_const(&)[58],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1e3,ERROR,
                 "\"failed: expected \" \"(0u) == (subReader.getBoolList().size())\", 0u, subReader.getBoolList().size()"
                 ,(char (*) [58])"failed: expected (0u) == (subReader.getBoolList().size())",
                 &local_3b0,&local_3b4);
      local_3a9 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Reader::getInt8List
            ((Reader *)local_418,(Reader *)local_130);
  uVar8 = List<signed_char,_(capnp::Kind)0>::Reader::size((Reader *)local_418);
  if (uVar8 != 0) {
    local_419 = kj::_::Debug::shouldLog(ERROR);
    while (local_419 != false) {
      local_420 = 0;
      capnproto_test::capnp::test::TestAllTypes::Reader::getInt8List(&local_458,(Reader *)local_130)
      ;
      local_424 = List<signed_char,_(capnp::Kind)0>::Reader::size(&local_458);
      kj::_::Debug::log<char_const(&)[58],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1e4,ERROR,
                 "\"failed: expected \" \"(0u) == (subReader.getInt8List().size())\", 0u, subReader.getInt8List().size()"
                 ,(char (*) [58])"failed: expected (0u) == (subReader.getInt8List().size())",
                 &local_420,&local_424);
      local_419 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Reader::getInt16List
            ((Reader *)local_488,(Reader *)local_130);
  uVar8 = List<short,_(capnp::Kind)0>::Reader::size((Reader *)local_488);
  if (uVar8 != 0) {
    local_489 = kj::_::Debug::shouldLog(ERROR);
    while (local_489 != false) {
      local_490 = 0;
      capnproto_test::capnp::test::TestAllTypes::Reader::getInt16List
                (&local_4c8,(Reader *)local_130);
      local_494 = List<short,_(capnp::Kind)0>::Reader::size(&local_4c8);
      kj::_::Debug::log<char_const(&)[59],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1e5,ERROR,
                 "\"failed: expected \" \"(0u) == (subReader.getInt16List().size())\", 0u, subReader.getInt16List().size()"
                 ,(char (*) [59])"failed: expected (0u) == (subReader.getInt16List().size())",
                 &local_490,&local_494);
      local_489 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Reader::getInt32List
            ((Reader *)local_4f8,(Reader *)local_130);
  uVar8 = List<int,_(capnp::Kind)0>::Reader::size((Reader *)local_4f8);
  if (uVar8 != 0) {
    local_4f9 = kj::_::Debug::shouldLog(ERROR);
    while (local_4f9 != false) {
      local_500 = 0;
      capnproto_test::capnp::test::TestAllTypes::Reader::getInt32List
                (&local_538,(Reader *)local_130);
      local_504 = List<int,_(capnp::Kind)0>::Reader::size(&local_538);
      kj::_::Debug::log<char_const(&)[59],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1e6,ERROR,
                 "\"failed: expected \" \"(0u) == (subReader.getInt32List().size())\", 0u, subReader.getInt32List().size()"
                 ,(char (*) [59])"failed: expected (0u) == (subReader.getInt32List().size())",
                 &local_500,&local_504);
      local_4f9 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Reader::getInt64List
            ((Reader *)local_568,(Reader *)local_130);
  uVar8 = List<long,_(capnp::Kind)0>::Reader::size((Reader *)local_568);
  if (uVar8 != 0) {
    local_569 = kj::_::Debug::shouldLog(ERROR);
    while (local_569 != false) {
      local_570 = 0;
      capnproto_test::capnp::test::TestAllTypes::Reader::getInt64List
                (&local_5a8,(Reader *)local_130);
      local_574 = List<long,_(capnp::Kind)0>::Reader::size(&local_5a8);
      kj::_::Debug::log<char_const(&)[59],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1e7,ERROR,
                 "\"failed: expected \" \"(0u) == (subReader.getInt64List().size())\", 0u, subReader.getInt64List().size()"
                 ,(char (*) [59])"failed: expected (0u) == (subReader.getInt64List().size())",
                 &local_570,&local_574);
      local_569 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Reader::getUInt8List
            ((Reader *)local_5d8,(Reader *)local_130);
  uVar8 = List<unsigned_char,_(capnp::Kind)0>::Reader::size((Reader *)local_5d8);
  if (uVar8 != 0) {
    local_5d9 = kj::_::Debug::shouldLog(ERROR);
    while (local_5d9 != false) {
      local_5e0 = 0;
      capnproto_test::capnp::test::TestAllTypes::Reader::getUInt8List
                (&local_618,(Reader *)local_130);
      local_5e4 = List<unsigned_char,_(capnp::Kind)0>::Reader::size(&local_618);
      kj::_::Debug::log<char_const(&)[59],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1e8,ERROR,
                 "\"failed: expected \" \"(0u) == (subReader.getUInt8List().size())\", 0u, subReader.getUInt8List().size()"
                 ,(char (*) [59])"failed: expected (0u) == (subReader.getUInt8List().size())",
                 &local_5e0,&local_5e4);
      local_5d9 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Reader::getUInt16List
            ((Reader *)local_648,(Reader *)local_130);
  uVar8 = List<unsigned_short,_(capnp::Kind)0>::Reader::size((Reader *)local_648);
  if (uVar8 != 0) {
    local_649 = kj::_::Debug::shouldLog(ERROR);
    while (local_649 != false) {
      local_650 = 0;
      capnproto_test::capnp::test::TestAllTypes::Reader::getUInt16List
                (&local_688,(Reader *)local_130);
      local_654 = List<unsigned_short,_(capnp::Kind)0>::Reader::size(&local_688);
      kj::_::Debug::log<char_const(&)[60],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1e9,ERROR,
                 "\"failed: expected \" \"(0u) == (subReader.getUInt16List().size())\", 0u, subReader.getUInt16List().size()"
                 ,(char (*) [60])"failed: expected (0u) == (subReader.getUInt16List().size())",
                 &local_650,&local_654);
      local_649 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Reader::getUInt32List
            ((Reader *)local_6b8,(Reader *)local_130);
  uVar8 = List<unsigned_int,_(capnp::Kind)0>::Reader::size((Reader *)local_6b8);
  if (uVar8 != 0) {
    local_6b9 = kj::_::Debug::shouldLog(ERROR);
    while (local_6b9 != false) {
      local_6c0 = 0;
      capnproto_test::capnp::test::TestAllTypes::Reader::getUInt32List
                (&local_6f8,(Reader *)local_130);
      local_6c4 = List<unsigned_int,_(capnp::Kind)0>::Reader::size(&local_6f8);
      kj::_::Debug::log<char_const(&)[60],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1ea,ERROR,
                 "\"failed: expected \" \"(0u) == (subReader.getUInt32List().size())\", 0u, subReader.getUInt32List().size()"
                 ,(char (*) [60])"failed: expected (0u) == (subReader.getUInt32List().size())",
                 &local_6c0,&local_6c4);
      local_6b9 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Reader::getUInt64List
            ((Reader *)local_728,(Reader *)local_130);
  uVar8 = List<unsigned_long,_(capnp::Kind)0>::Reader::size((Reader *)local_728);
  if (uVar8 != 0) {
    local_729 = kj::_::Debug::shouldLog(ERROR);
    while (local_729 != false) {
      local_730 = 0;
      capnproto_test::capnp::test::TestAllTypes::Reader::getUInt64List
                (&local_768,(Reader *)local_130);
      local_734 = List<unsigned_long,_(capnp::Kind)0>::Reader::size(&local_768);
      kj::_::Debug::log<char_const(&)[60],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1eb,ERROR,
                 "\"failed: expected \" \"(0u) == (subReader.getUInt64List().size())\", 0u, subReader.getUInt64List().size()"
                 ,(char (*) [60])"failed: expected (0u) == (subReader.getUInt64List().size())",
                 &local_730,&local_734);
      local_729 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Reader::getFloat32List
            ((Reader *)local_798,(Reader *)local_130);
  uVar8 = List<float,_(capnp::Kind)0>::Reader::size((Reader *)local_798);
  if (uVar8 != 0) {
    local_799 = kj::_::Debug::shouldLog(ERROR);
    while (local_799 != false) {
      local_7a0 = 0;
      capnproto_test::capnp::test::TestAllTypes::Reader::getFloat32List
                (&local_7d8,(Reader *)local_130);
      local_7a4 = List<float,_(capnp::Kind)0>::Reader::size(&local_7d8);
      kj::_::Debug::log<char_const(&)[61],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1ec,ERROR,
                 "\"failed: expected \" \"(0u) == (subReader.getFloat32List().size())\", 0u, subReader.getFloat32List().size()"
                 ,(char (*) [61])"failed: expected (0u) == (subReader.getFloat32List().size())",
                 &local_7a0,&local_7a4);
      local_799 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Reader::getFloat64List
            ((Reader *)local_808,(Reader *)local_130);
  uVar8 = List<double,_(capnp::Kind)0>::Reader::size((Reader *)local_808);
  if (uVar8 != 0) {
    local_809 = kj::_::Debug::shouldLog(ERROR);
    while (local_809 != false) {
      local_810 = 0;
      capnproto_test::capnp::test::TestAllTypes::Reader::getFloat64List
                (&local_848,(Reader *)local_130);
      local_814 = List<double,_(capnp::Kind)0>::Reader::size(&local_848);
      kj::_::Debug::log<char_const(&)[61],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1ed,ERROR,
                 "\"failed: expected \" \"(0u) == (subReader.getFloat64List().size())\", 0u, subReader.getFloat64List().size()"
                 ,(char (*) [61])"failed: expected (0u) == (subReader.getFloat64List().size())",
                 &local_810,&local_814);
      local_809 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Reader::getTextList
            ((Reader *)local_878,(Reader *)local_130);
  uVar8 = List<capnp::Text,_(capnp::Kind)1>::Reader::size((Reader *)local_878);
  if (uVar8 != 0) {
    local_879 = kj::_::Debug::shouldLog(ERROR);
    while (local_879 != false) {
      local_880 = 0;
      capnproto_test::capnp::test::TestAllTypes::Reader::getTextList(&local_8b8,(Reader *)local_130)
      ;
      local_884 = List<capnp::Text,_(capnp::Kind)1>::Reader::size(&local_8b8);
      kj::_::Debug::log<char_const(&)[58],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1ee,ERROR,
                 "\"failed: expected \" \"(0u) == (subReader.getTextList().size())\", 0u, subReader.getTextList().size()"
                 ,(char (*) [58])"failed: expected (0u) == (subReader.getTextList().size())",
                 &local_880,&local_884);
      local_879 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Reader::getDataList
            ((Reader *)local_8e8,(Reader *)local_130);
  uVar8 = List<capnp::Data,_(capnp::Kind)1>::Reader::size((Reader *)local_8e8);
  if (uVar8 != 0) {
    local_8e9 = kj::_::Debug::shouldLog(ERROR);
    while (local_8e9 != false) {
      local_8f0 = 0;
      capnproto_test::capnp::test::TestAllTypes::Reader::getDataList(&local_928,(Reader *)local_130)
      ;
      local_8f4 = List<capnp::Data,_(capnp::Kind)1>::Reader::size(&local_928);
      kj::_::Debug::log<char_const(&)[58],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1ef,ERROR,
                 "\"failed: expected \" \"(0u) == (subReader.getDataList().size())\", 0u, subReader.getDataList().size()"
                 ,(char (*) [58])"failed: expected (0u) == (subReader.getDataList().size())",
                 &local_8f0,&local_8f4);
      local_8e9 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Reader::getStructList
            ((Reader *)local_958,(Reader *)local_130);
  uVar8 = List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Reader::size
                    ((Reader *)local_958);
  if (uVar8 != 0) {
    local_959 = kj::_::Debug::shouldLog(ERROR);
    while (local_959 != false) {
      local_960 = 0;
      capnproto_test::capnp::test::TestAllTypes::Reader::getStructList
                (&local_998,(Reader *)local_130);
      local_964 = List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Reader::size
                            (&local_998);
      kj::_::Debug::log<char_const(&)[60],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1f0,ERROR,
                 "\"failed: expected \" \"(0u) == (subReader.getStructList().size())\", 0u, subReader.getStructList().size()"
                 ,(char (*) [60])"failed: expected (0u) == (subReader.getStructList().size())",
                 &local_960,&local_964);
      local_959 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Reader::getVoidList
            ((Reader *)local_9c8,(Reader *)&stack0x00000008);
  uVar8 = List<capnp::Void,_(capnp::Kind)0>::Reader::size((Reader *)local_9c8);
  if (uVar8 != 0) {
    local_9c9 = kj::_::Debug::shouldLog(ERROR);
    while (local_9c9 != false) {
      local_9d0 = 0;
      capnproto_test::capnp::test::TestAllTypes::Reader::getVoidList
                (&local_a08,(Reader *)&stack0x00000008);
      local_9d4 = List<capnp::Void,_(capnp::Kind)0>::Reader::size(&local_a08);
      kj::_::Debug::log<char_const(&)[55],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,499,ERROR,
                 "\"failed: expected \" \"(0u) == (reader.getVoidList().size())\", 0u, reader.getVoidList().size()"
                 ,(char (*) [55])"failed: expected (0u) == (reader.getVoidList().size())",&local_9d0
                 ,&local_9d4);
      local_9c9 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Reader::getBoolList
            ((Reader *)local_a38,(Reader *)&stack0x00000008);
  uVar8 = List<bool,_(capnp::Kind)0>::Reader::size((Reader *)local_a38);
  if (uVar8 != 0) {
    local_a39 = kj::_::Debug::shouldLog(ERROR);
    while (local_a39 != false) {
      local_a40 = 0;
      capnproto_test::capnp::test::TestAllTypes::Reader::getBoolList
                (&local_a78,(Reader *)&stack0x00000008);
      local_a44 = List<bool,_(capnp::Kind)0>::Reader::size(&local_a78);
      kj::_::Debug::log<char_const(&)[55],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,500,ERROR,
                 "\"failed: expected \" \"(0u) == (reader.getBoolList().size())\", 0u, reader.getBoolList().size()"
                 ,(char (*) [55])"failed: expected (0u) == (reader.getBoolList().size())",&local_a40
                 ,&local_a44);
      local_a39 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Reader::getInt8List
            ((Reader *)local_aa8,(Reader *)&stack0x00000008);
  uVar8 = List<signed_char,_(capnp::Kind)0>::Reader::size((Reader *)local_aa8);
  if (uVar8 != 0) {
    local_aa9 = kj::_::Debug::shouldLog(ERROR);
    while (local_aa9 != false) {
      local_ab0 = 0;
      capnproto_test::capnp::test::TestAllTypes::Reader::getInt8List
                (&local_ae8,(Reader *)&stack0x00000008);
      local_ab4 = List<signed_char,_(capnp::Kind)0>::Reader::size(&local_ae8);
      kj::_::Debug::log<char_const(&)[55],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1f5,ERROR,
                 "\"failed: expected \" \"(0u) == (reader.getInt8List().size())\", 0u, reader.getInt8List().size()"
                 ,(char (*) [55])"failed: expected (0u) == (reader.getInt8List().size())",&local_ab0
                 ,&local_ab4);
      local_aa9 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Reader::getInt16List
            ((Reader *)local_b18,(Reader *)&stack0x00000008);
  uVar8 = List<short,_(capnp::Kind)0>::Reader::size((Reader *)local_b18);
  if (uVar8 != 0) {
    local_b19 = kj::_::Debug::shouldLog(ERROR);
    while (local_b19 != false) {
      local_b20 = 0;
      capnproto_test::capnp::test::TestAllTypes::Reader::getInt16List
                (&local_b58,(Reader *)&stack0x00000008);
      local_b24 = List<short,_(capnp::Kind)0>::Reader::size(&local_b58);
      kj::_::Debug::log<char_const(&)[56],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1f6,ERROR,
                 "\"failed: expected \" \"(0u) == (reader.getInt16List().size())\", 0u, reader.getInt16List().size()"
                 ,(char (*) [56])"failed: expected (0u) == (reader.getInt16List().size())",
                 &local_b20,&local_b24);
      local_b19 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Reader::getInt32List
            ((Reader *)local_b88,(Reader *)&stack0x00000008);
  uVar8 = List<int,_(capnp::Kind)0>::Reader::size((Reader *)local_b88);
  if (uVar8 != 0) {
    local_b89 = kj::_::Debug::shouldLog(ERROR);
    while (local_b89 != false) {
      local_b90 = 0;
      capnproto_test::capnp::test::TestAllTypes::Reader::getInt32List
                (&local_bc8,(Reader *)&stack0x00000008);
      local_b94 = List<int,_(capnp::Kind)0>::Reader::size(&local_bc8);
      kj::_::Debug::log<char_const(&)[56],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1f7,ERROR,
                 "\"failed: expected \" \"(0u) == (reader.getInt32List().size())\", 0u, reader.getInt32List().size()"
                 ,(char (*) [56])"failed: expected (0u) == (reader.getInt32List().size())",
                 &local_b90,&local_b94);
      local_b89 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Reader::getInt64List
            ((Reader *)local_bf8,(Reader *)&stack0x00000008);
  uVar8 = List<long,_(capnp::Kind)0>::Reader::size((Reader *)local_bf8);
  if (uVar8 != 0) {
    local_bf9 = kj::_::Debug::shouldLog(ERROR);
    while (local_bf9 != false) {
      local_c00 = 0;
      capnproto_test::capnp::test::TestAllTypes::Reader::getInt64List
                (&local_c38,(Reader *)&stack0x00000008);
      local_c04 = List<long,_(capnp::Kind)0>::Reader::size(&local_c38);
      kj::_::Debug::log<char_const(&)[56],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1f8,ERROR,
                 "\"failed: expected \" \"(0u) == (reader.getInt64List().size())\", 0u, reader.getInt64List().size()"
                 ,(char (*) [56])"failed: expected (0u) == (reader.getInt64List().size())",
                 &local_c00,&local_c04);
      local_bf9 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Reader::getUInt8List
            ((Reader *)local_c68,(Reader *)&stack0x00000008);
  uVar8 = List<unsigned_char,_(capnp::Kind)0>::Reader::size((Reader *)local_c68);
  if (uVar8 != 0) {
    local_c69 = kj::_::Debug::shouldLog(ERROR);
    while (local_c69 != false) {
      local_c70 = 0;
      capnproto_test::capnp::test::TestAllTypes::Reader::getUInt8List
                (&local_ca8,(Reader *)&stack0x00000008);
      local_c74 = List<unsigned_char,_(capnp::Kind)0>::Reader::size(&local_ca8);
      kj::_::Debug::log<char_const(&)[56],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1f9,ERROR,
                 "\"failed: expected \" \"(0u) == (reader.getUInt8List().size())\", 0u, reader.getUInt8List().size()"
                 ,(char (*) [56])"failed: expected (0u) == (reader.getUInt8List().size())",
                 &local_c70,&local_c74);
      local_c69 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Reader::getUInt16List
            ((Reader *)local_cd8,(Reader *)&stack0x00000008);
  uVar8 = List<unsigned_short,_(capnp::Kind)0>::Reader::size((Reader *)local_cd8);
  if (uVar8 != 0) {
    local_cd9 = kj::_::Debug::shouldLog(ERROR);
    while (local_cd9 != false) {
      local_ce0 = 0;
      capnproto_test::capnp::test::TestAllTypes::Reader::getUInt16List
                (&local_d18,(Reader *)&stack0x00000008);
      local_ce4 = List<unsigned_short,_(capnp::Kind)0>::Reader::size(&local_d18);
      kj::_::Debug::log<char_const(&)[57],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1fa,ERROR,
                 "\"failed: expected \" \"(0u) == (reader.getUInt16List().size())\", 0u, reader.getUInt16List().size()"
                 ,(char (*) [57])"failed: expected (0u) == (reader.getUInt16List().size())",
                 &local_ce0,&local_ce4);
      local_cd9 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Reader::getUInt32List
            ((Reader *)local_d48,(Reader *)&stack0x00000008);
  uVar8 = List<unsigned_int,_(capnp::Kind)0>::Reader::size((Reader *)local_d48);
  if (uVar8 != 0) {
    local_d49 = kj::_::Debug::shouldLog(ERROR);
    while (local_d49 != false) {
      local_d50 = 0;
      capnproto_test::capnp::test::TestAllTypes::Reader::getUInt32List
                (&local_d88,(Reader *)&stack0x00000008);
      local_d54 = List<unsigned_int,_(capnp::Kind)0>::Reader::size(&local_d88);
      kj::_::Debug::log<char_const(&)[57],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1fb,ERROR,
                 "\"failed: expected \" \"(0u) == (reader.getUInt32List().size())\", 0u, reader.getUInt32List().size()"
                 ,(char (*) [57])"failed: expected (0u) == (reader.getUInt32List().size())",
                 &local_d50,&local_d54);
      local_d49 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Reader::getUInt64List
            ((Reader *)local_db8,(Reader *)&stack0x00000008);
  uVar8 = List<unsigned_long,_(capnp::Kind)0>::Reader::size((Reader *)local_db8);
  if (uVar8 != 0) {
    local_db9 = kj::_::Debug::shouldLog(ERROR);
    while (local_db9 != false) {
      local_dc0 = 0;
      capnproto_test::capnp::test::TestAllTypes::Reader::getUInt64List
                (&local_df8,(Reader *)&stack0x00000008);
      local_dc4 = List<unsigned_long,_(capnp::Kind)0>::Reader::size(&local_df8);
      kj::_::Debug::log<char_const(&)[57],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1fc,ERROR,
                 "\"failed: expected \" \"(0u) == (reader.getUInt64List().size())\", 0u, reader.getUInt64List().size()"
                 ,(char (*) [57])"failed: expected (0u) == (reader.getUInt64List().size())",
                 &local_dc0,&local_dc4);
      local_db9 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Reader::getFloat32List
            ((Reader *)local_e28,(Reader *)&stack0x00000008);
  uVar8 = List<float,_(capnp::Kind)0>::Reader::size((Reader *)local_e28);
  if (uVar8 != 0) {
    local_e29 = kj::_::Debug::shouldLog(ERROR);
    while (local_e29 != false) {
      local_e30 = 0;
      capnproto_test::capnp::test::TestAllTypes::Reader::getFloat32List
                (&local_e68,(Reader *)&stack0x00000008);
      local_e34 = List<float,_(capnp::Kind)0>::Reader::size(&local_e68);
      kj::_::Debug::log<char_const(&)[58],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1fd,ERROR,
                 "\"failed: expected \" \"(0u) == (reader.getFloat32List().size())\", 0u, reader.getFloat32List().size()"
                 ,(char (*) [58])"failed: expected (0u) == (reader.getFloat32List().size())",
                 &local_e30,&local_e34);
      local_e29 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Reader::getFloat64List
            ((Reader *)local_e98,(Reader *)&stack0x00000008);
  uVar8 = List<double,_(capnp::Kind)0>::Reader::size((Reader *)local_e98);
  if (uVar8 != 0) {
    local_e99 = kj::_::Debug::shouldLog(ERROR);
    while (local_e99 != false) {
      local_ea0 = 0;
      capnproto_test::capnp::test::TestAllTypes::Reader::getFloat64List
                (&local_ed8,(Reader *)&stack0x00000008);
      local_ea4 = List<double,_(capnp::Kind)0>::Reader::size(&local_ed8);
      kj::_::Debug::log<char_const(&)[58],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1fe,ERROR,
                 "\"failed: expected \" \"(0u) == (reader.getFloat64List().size())\", 0u, reader.getFloat64List().size()"
                 ,(char (*) [58])"failed: expected (0u) == (reader.getFloat64List().size())",
                 &local_ea0,&local_ea4);
      local_e99 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Reader::getTextList
            ((Reader *)local_f08,(Reader *)&stack0x00000008);
  uVar8 = List<capnp::Text,_(capnp::Kind)1>::Reader::size((Reader *)local_f08);
  if (uVar8 != 0) {
    local_f09 = kj::_::Debug::shouldLog(ERROR);
    while (local_f09 != false) {
      local_f10 = 0;
      capnproto_test::capnp::test::TestAllTypes::Reader::getTextList
                (&local_f48,(Reader *)&stack0x00000008);
      local_f14 = List<capnp::Text,_(capnp::Kind)1>::Reader::size(&local_f48);
      kj::_::Debug::log<char_const(&)[55],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1ff,ERROR,
                 "\"failed: expected \" \"(0u) == (reader.getTextList().size())\", 0u, reader.getTextList().size()"
                 ,(char (*) [55])"failed: expected (0u) == (reader.getTextList().size())",&local_f10
                 ,&local_f14);
      local_f09 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Reader::getDataList
            ((Reader *)local_f78,(Reader *)&stack0x00000008);
  uVar8 = List<capnp::Data,_(capnp::Kind)1>::Reader::size((Reader *)local_f78);
  if (uVar8 != 0) {
    local_f79 = kj::_::Debug::shouldLog(ERROR);
    while (local_f79 != false) {
      local_f80 = 0;
      capnproto_test::capnp::test::TestAllTypes::Reader::getDataList
                (&local_fb8,(Reader *)&stack0x00000008);
      local_f84 = List<capnp::Data,_(capnp::Kind)1>::Reader::size(&local_fb8);
      kj::_::Debug::log<char_const(&)[55],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x200,ERROR,
                 "\"failed: expected \" \"(0u) == (reader.getDataList().size())\", 0u, reader.getDataList().size()"
                 ,(char (*) [55])"failed: expected (0u) == (reader.getDataList().size())",&local_f80
                 ,&local_f84);
      local_f79 = false;
    }
  }
  capnproto_test::capnp::test::TestAllTypes::Reader::getStructList
            ((Reader *)local_fe8,(Reader *)&stack0x00000008);
  uVar8 = List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Reader::size
                    ((Reader *)local_fe8);
  if (uVar8 != 0) {
    local_fe9 = kj::_::Debug::shouldLog(ERROR);
    while (local_fe9 != false) {
      local_ff0 = 0;
      capnproto_test::capnp::test::TestAllTypes::Reader::getStructList
                (&local_1028,(Reader *)&stack0x00000008);
      local_ff4 = List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Reader::size
                            (&local_1028);
      kj::_::Debug::log<char_const(&)[57],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x201,ERROR,
                 "\"failed: expected \" \"(0u) == (reader.getStructList().size())\", 0u, reader.getStructList().size()"
                 ,(char (*) [57])"failed: expected (0u) == (reader.getStructList().size())",
                 &local_ff0,&local_ff4);
      local_fe9 = false;
    }
  }
  return;
}

Assistant:

void genericCheckTestMessageAllZero(Reader reader) {
  EXPECT_EQ(VOID, reader.getVoidField());
  EXPECT_EQ(false, reader.getBoolField());
  EXPECT_EQ(0, reader.getInt8Field());
  EXPECT_EQ(0, reader.getInt16Field());
  EXPECT_EQ(0, reader.getInt32Field());
  EXPECT_EQ(0, reader.getInt64Field());
  EXPECT_EQ(0u, reader.getUInt8Field());
  EXPECT_EQ(0u, reader.getUInt16Field());
  EXPECT_EQ(0u, reader.getUInt32Field());
  EXPECT_EQ(0u, reader.getUInt64Field());
  EXPECT_FLOAT_EQ(0, reader.getFloat32Field());
  EXPECT_DOUBLE_EQ(0, reader.getFloat64Field());
  EXPECT_EQ("", reader.getTextField());
  EXPECT_EQ(data(""), reader.getDataField());
  {
    auto subReader = reader.getStructField();
    EXPECT_EQ(VOID, subReader.getVoidField());
    EXPECT_EQ(false, subReader.getBoolField());
    EXPECT_EQ(0, subReader.getInt8Field());
    EXPECT_EQ(0, subReader.getInt16Field());
    EXPECT_EQ(0, subReader.getInt32Field());
    EXPECT_EQ(0, subReader.getInt64Field());
    EXPECT_EQ(0u, subReader.getUInt8Field());
    EXPECT_EQ(0u, subReader.getUInt16Field());
    EXPECT_EQ(0u, subReader.getUInt32Field());
    EXPECT_EQ(0u, subReader.getUInt64Field());
    EXPECT_FLOAT_EQ(0, subReader.getFloat32Field());
    EXPECT_DOUBLE_EQ(0, subReader.getFloat64Field());
    EXPECT_EQ("", subReader.getTextField());
    EXPECT_EQ(data(""), subReader.getDataField());
    {
      auto subSubReader = subReader.getStructField();
      EXPECT_EQ("", subSubReader.getTextField());
      EXPECT_EQ("", subSubReader.getStructField().getTextField());
    }

    EXPECT_EQ(0u, subReader.getVoidList().size());
    EXPECT_EQ(0u, subReader.getBoolList().size());
    EXPECT_EQ(0u, subReader.getInt8List().size());
    EXPECT_EQ(0u, subReader.getInt16List().size());
    EXPECT_EQ(0u, subReader.getInt32List().size());
    EXPECT_EQ(0u, subReader.getInt64List().size());
    EXPECT_EQ(0u, subReader.getUInt8List().size());
    EXPECT_EQ(0u, subReader.getUInt16List().size());
    EXPECT_EQ(0u, subReader.getUInt32List().size());
    EXPECT_EQ(0u, subReader.getUInt64List().size());
    EXPECT_EQ(0u, subReader.getFloat32List().size());
    EXPECT_EQ(0u, subReader.getFloat64List().size());
    EXPECT_EQ(0u, subReader.getTextList().size());
    EXPECT_EQ(0u, subReader.getDataList().size());
    EXPECT_EQ(0u, subReader.getStructList().size());
  }

  EXPECT_EQ(0u, reader.getVoidList().size());
  EXPECT_EQ(0u, reader.getBoolList().size());
  EXPECT_EQ(0u, reader.getInt8List().size());
  EXPECT_EQ(0u, reader.getInt16List().size());
  EXPECT_EQ(0u, reader.getInt32List().size());
  EXPECT_EQ(0u, reader.getInt64List().size());
  EXPECT_EQ(0u, reader.getUInt8List().size());
  EXPECT_EQ(0u, reader.getUInt16List().size());
  EXPECT_EQ(0u, reader.getUInt32List().size());
  EXPECT_EQ(0u, reader.getUInt64List().size());
  EXPECT_EQ(0u, reader.getFloat32List().size());
  EXPECT_EQ(0u, reader.getFloat64List().size());
  EXPECT_EQ(0u, reader.getTextList().size());
  EXPECT_EQ(0u, reader.getDataList().size());
  EXPECT_EQ(0u, reader.getStructList().size());
}